

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QList<QUrl> * __thiscall QFileDialogPrivate::userSelectedFiles(QFileDialogPrivate *this)

{
  bool bVar1;
  long in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *path;
  QStringList *__range2;
  QModelIndex *index;
  QModelIndexList *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList typedFilesList;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList selectedRows;
  QList<QUrl> files;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  byte bVar2;
  byte bVar3;
  QFileDialogPrivate *this_00;
  QModelIndex *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  byte bVar4;
  QList<QUrl> *in_stack_fffffffffffffee0;
  QFileDialogPrivate *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  QUrl local_f8;
  QString *local_f0;
  qsizetype in_stack_ffffffffffffff18;
  const_iterator cVar5;
  const_iterator local_e0;
  QList<QString> local_d8 [3];
  QUrl local_90;
  QModelIndex *local_88;
  const_iterator local_80;
  const_iterator local_78;
  QList<QModelIndex> local_70 [2];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QUrl>::QList((QList<QUrl> *)0x751057);
  bVar1 = usingWidgets(in_RDI);
  if (bVar1) {
    local_70[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_70[0].d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_70[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
               (in_RSI + 0x370));
    QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
    QItemSelectionModel::selectedRows((int)local_70);
    QList<QModelIndex>::size(local_70);
    QList<QUrl>::reserve
              ((QList<QUrl> *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               in_stack_ffffffffffffff18);
    local_78.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_RDI);
    local_80.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_80 = QList<QModelIndex>::end((QList<QModelIndex> *)in_RDI);
    while( true ) {
      local_88 = local_80.i;
      bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_78,local_80);
      if (!bVar1) break;
      QList<QModelIndex>::const_iterator::operator*(&local_78);
      QModelIndex::data(in_stack_fffffffffffffec8,(int)((ulong)in_RSI >> 0x20));
      ::QVariant::toString();
      QUrl::fromLocalFile((QString *)&local_90);
      QList<QUrl>::append((QList<QUrl> *)in_RDI,
                          (rvalue_ref)
                          CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
      QUrl::~QUrl(&local_90);
      QString::~QString((QString *)0x75123e);
      ::QVariant::~QVariant(&local_28);
      QList<QModelIndex>::const_iterator::operator++(&local_78);
    }
    bVar1 = QList<QUrl>::isEmpty((QList<QUrl> *)0x75126a);
    bVar4 = 0;
    bVar2 = 0;
    if (bVar1) {
      lineEdit((QFileDialogPrivate *)0x751288);
      QLineEdit::text((QLineEdit *)this_00);
      bVar4 = 1;
      bVar1 = QString::isEmpty((QString *)0x7512aa);
      bVar2 = bVar1 ^ 0xff;
    }
    bVar3 = bVar2;
    if ((bVar4 & 1) != 0) {
      QString::~QString((QString *)0x7512ce);
    }
    if ((bVar2 & 1) != 0) {
      local_d8[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      typedFiles((QFileDialogPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                );
      QList<QString>::size(local_d8);
      QList<QUrl>::reserve
                ((QList<QUrl> *)CONCAT17(bVar4,in_stack_fffffffffffffed8),in_stack_ffffffffffffff18)
      ;
      local_e0.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_e0 = QList<QString>::begin((QList<QString> *)in_RDI);
      local_f0 = (QString *)QList<QString>::end((QList<QString> *)in_RDI);
      while (cVar5.i = local_f0,
            bVar1 = QList<QString>::const_iterator::operator!=(&local_e0,(const_iterator)local_f0),
            bVar1) {
        QList<QString>::const_iterator::operator*(&local_e0);
        QUrl::fromLocalFile((QString *)&local_f8);
        QList<QUrl>::append((QList<QUrl> *)in_RDI,
                            (rvalue_ref)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_fffffffffffffea8)));
        QUrl::~QUrl(&local_f8);
        QList<QString>::const_iterator::operator++(&local_e0);
        local_f0 = cVar5.i;
      }
      QList<QString>::~QList((QList<QString> *)0x75140a);
    }
    QList<QUrl>::QList((QList<QUrl> *)in_RDI,
                       (QList<QUrl> *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_fffffffffffffea8)));
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x751431);
  }
  else {
    selectedFiles_sys(this_00);
    addDefaultSuffixToUrls(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    QList<QUrl>::~QList((QList<QUrl> *)0x75109b);
  }
  QList<QUrl>::~QList((QList<QUrl> *)0x75143e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QUrl> *)this_00;
}

Assistant:

QList<QUrl> QFileDialogPrivate::userSelectedFiles() const
{
    QList<QUrl> files;

    if (!usingWidgets())
        return addDefaultSuffixToUrls(selectedFiles_sys());

    const QModelIndexList selectedRows = qFileDialogUi->listView->selectionModel()->selectedRows();
    files.reserve(selectedRows.size());
    for (const QModelIndex &index : selectedRows)
        files.append(QUrl::fromLocalFile(index.data(QFileSystemModel::FilePathRole).toString()));

    if (files.isEmpty() && !lineEdit()->text().isEmpty()) {
        const QStringList typedFilesList = typedFiles();
        files.reserve(typedFilesList.size());
        for (const QString &path : typedFilesList)
            files.append(QUrl::fromLocalFile(path));
    }

    return files;
}